

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *this_00;
  bool bVar1;
  LogMessage *pLVar2;
  reference __x;
  Tree *tree;
  LogMessage local_100;
  Node *local_c8;
  Node *head;
  LogMessage local_b8;
  Node *local_80;
  Node *item;
  size_type b;
  bool is_list;
  iterator tree_it;
  LogMessage local_48;
  InnerMap *local_10;
  InnerMap *this_local;
  
  local_10 = this;
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x248);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree_it._M_node + 3),pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&stack0xffffffffffffff98);
  b._7_1_ = iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
            ::revalidate_if_necessary(&it,(TreeIterator *)&stack0xffffffffffffff98);
  item = (Node *)it.bucket_index_;
  local_80 = it.node_;
  if ((bool)b._7_1_) {
    bVar1 = TableEntryIsNonEmptyList(this,it.bucket_index_);
    head._7_1_ = 0;
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x24e);
      head._7_1_ = 1;
      pLVar2 = internal::LogMessage::operator<<
                         (&local_b8,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&head + 6),pLVar2);
    }
    if ((head._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b8);
    }
    local_c8 = (Node *)this->table_[(long)item];
    local_c8 = EraseFromLinkedList(this,local_80,local_c8);
    this->table_[(long)item] = local_c8;
  }
  else {
    bVar1 = TableEntryIsTree(this,it.bucket_index_);
    tree._7_1_ = 0;
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x253);
      tree._7_1_ = 1;
      pLVar2 = internal::LogMessage::operator<<(&local_100,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 6),pLVar2);
    }
    if ((tree._7_1_ & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_100);
    }
    this_00 = (set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
               *)this->table_[(long)item];
    __x = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                    ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&stack0xffffffffffffff98
                    );
    std::
    set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
    ::erase(this_00,__x);
    bVar1 = std::
            set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
            ::empty(this_00);
    if (bVar1) {
      item = (Node *)((ulong)item & 0xfffffffffffffffe);
      DestroyTree(this,this_00);
      this->table_[(long)&(item->kv).k_.val_.string_value_ + 1] = (void *)0x0;
      this->table_[(long)item] = (void *)0x0;
    }
  }
  DestroyNode(this,local_80);
  this->num_elements_ = this->num_elements_ - 1;
  if (item == (Node *)this->index_of_first_non_null_) {
    while( true ) {
      bVar1 = false;
      if (this->index_of_first_non_null_ < this->num_buckets_) {
        bVar1 = this->table_[this->index_of_first_non_null_] == (void *)0x0;
      }
      if (!bVar1) break;
      this->index_of_first_non_null_ = this->index_of_first_non_null_ + 1;
    }
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (GOOGLE_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }